

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O3

ADL_MIDIPlayer * adl_init(long sample_rate)

{
  ADL_MIDIPlayer *__ptr;
  MIDIplay *this;
  
  __ptr = (ADL_MIDIPlayer *)malloc(8);
  if (__ptr != (ADL_MIDIPlayer *)0x0) {
    this = (MIDIplay *)operator_new(0x1200,(nothrow_t *)&std::nothrow);
    if (this != (MIDIplay *)0x0) {
      MIDIplay::MIDIplay(this,sample_rate);
      __ptr->adl_midiPlayer = this;
      adlCalculateFourOpChannels(this,false);
      return __ptr;
    }
    free(__ptr);
  }
  std::__cxx11::string::_M_replace
            (0x21d420,0,(char *)ADLMIDI_ErrorString_abi_cxx11_._M_string_length,0x1a6b08);
  return (ADL_MIDIPlayer *)0x0;
}

Assistant:

ADLMIDI_EXPORT struct ADL_MIDIPlayer *adl_init(long sample_rate)
{
    ADL_MIDIPlayer *midi_device;
    midi_device = (ADL_MIDIPlayer *)malloc(sizeof(ADL_MIDIPlayer));
    if(!midi_device)
    {
        ADLMIDI_ErrorString = "Can't initialize ADLMIDI: out of memory!";
        return NULL;
    }

    MIDIplay *player = new(std::nothrow) MIDIplay(static_cast<unsigned long>(sample_rate));
    if(!player)
    {
        free(midi_device);
        ADLMIDI_ErrorString = "Can't initialize ADLMIDI: out of memory!";
        return NULL;
    }
    midi_device->adl_midiPlayer = player;
    adlCalculateFourOpChannels(player);
    return midi_device;
}